

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeSerializer.cpp
# Opt level: O2

FunctionBody *
Js::ByteCodeSerializer::DeserializeFunction
          (ScriptContext *scriptContext,DeferDeserializeFunctionInfo *deferredFunction)

{
  ByteCodeCache *cache;
  code *pcVar1;
  bool bVar2;
  HRESULT HVar3;
  undefined4 *puVar4;
  FunctionBody *local_18;
  FunctionBody *deserializedFunctionBody;
  
  local_18 = (FunctionBody *)0x0;
  cache = (deferredFunction->m_cache).ptr;
  HVar3 = ByteCodeBufferReader::ReadFunctionBody
                    (cache->reader,(deferredFunction->m_functionBytes).ptr,
                     (FunctionProxy **)&local_18,
                     (deferredFunction->super_FunctionProxy).m_utf8SourceInfo.ptr,cache,
                     (deferredFunction->m_nativeModule).ptr,true,false,deferredFunction);
  if (-1 < HVar3) {
    return local_18;
  }
  AssertCount = AssertCount + 1;
  Throw::LogAssert();
  puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  *puVar4 = 1;
  bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeSerializer.cpp"
                              ,0x13e8,"(false)","false");
  if (bVar2) {
    *puVar4 = 0;
    Throw::InternalError();
  }
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

FunctionBody* ByteCodeSerializer::DeserializeFunction(ScriptContext* scriptContext, DeferDeserializeFunctionInfo* deferredFunction)
{
    FunctionBody* deserializedFunctionBody = nullptr;
    ByteCodeCache* cache = deferredFunction->m_cache;
    ByteCodeBufferReader* reader = cache->GetReader();
    HRESULT hr = reader->ReadFunctionBody(deferredFunction->m_functionBytes, (FunctionProxy **)&deserializedFunctionBody, deferredFunction->GetUtf8SourceInfo(), cache, deferredFunction->m_nativeModule, true /* deserialize this */, false /* deserialize nested functions */, deferredFunction);
    if (FAILED(hr))
    {
        // This should never happen as the code is currently
        // structured since we validate the serialized bytecode during creation
        // of function proxies. In the future though, when we reorganize the byte
        // code file format, we could hit this error, in which case we
        // need a strategy to deal with this.
        Assert(false);
        Js::Throw::InternalError();
    }

    return deserializedFunctionBody;
}